

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicBWT.h
# Opt level: O1

ulint __thiscall
bwtil::
DynamicBWT<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_bwtil::dynamic_vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
::extend(DynamicBWT<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_bwtil::dynamic_vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
         *this,symbol s)

{
  pointer puVar1;
  unsigned_long uVar2;
  pointer puVar3;
  _Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false> _Var4;
  subtree_ref t;
  subtree_const_ref t_00;
  ulint uVar5;
  size_t i;
  undefined7 in_register_00000031;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::insert
            (&this->ds,s,this->terminator_pos);
  uVar6 = CONCAT71(in_register_00000031,s) & 0xffffffff;
  uVar2 = (this->F).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6];
  uVar5 = DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::rank
                    (&this->ds,s,this->terminator_pos);
  this->terminator_pos = uVar5 + uVar2;
  uVar6 = uVar6 + 1;
  if (uVar6 < this->sigma) {
    puVar3 = (this->F).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      puVar1 = puVar3 + uVar6;
      *puVar1 = *puVar1 + 1;
      uVar6 = uVar6 + 1;
    } while (uVar6 < this->sigma);
  }
  if (this->sample_rate != 0) {
    uVar6 = this->current_size;
    bVar7 = uVar6 % this->sample_rate == 0;
    bVar8 = uVar6 == this->n - 1;
    _Var4._M_head_impl =
         (this->sampled_positions)._impl._M_t.
         super___uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
         .super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>.
         _M_head_impl;
    t.super_subtree_ref_base<false>._index = 0;
    t.super_subtree_ref_base<false>._vector = _Var4._M_head_impl;
    t.super_subtree_ref_base<false>._height = (_Var4._M_head_impl)->height;
    t.super_subtree_ref_base<false>._size = (_Var4._M_head_impl)->size;
    t.super_subtree_ref_base<false>._rank = (_Var4._M_head_impl)->rank;
    bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::insert
              (_Var4._M_head_impl,t,this->terminator_pos,bVar8 || bVar7);
    if (bVar8 || bVar7) {
      _Var4._M_head_impl =
           (this->sampled_positions)._impl._M_t.
           super___uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
           .
           super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>
           ._M_head_impl;
      t_00._index = 0;
      t_00._vector = _Var4._M_head_impl;
      t_00._height = (_Var4._M_head_impl)->height;
      t_00._size = (_Var4._M_head_impl)->size;
      t_00._rank = (_Var4._M_head_impl)->rank;
      i = bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::getrank
                    (_Var4._M_head_impl,t_00,this->terminator_pos,0);
      dynamic_vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::insert
                (&this->sa_samples,i,this->current_size);
    }
  }
  this->current_size = this->current_size + 1;
  return this->terminator_pos;
}

Assistant:

ulint extend(symbol s){

		//insert in position terminator_pos character s
		ds.insert(s,terminator_pos);

		//update terminator position
		terminator_pos = F[s] + ds.rank(s,terminator_pos);

		//update F
		for(ulint i=s+1;i<sigma;i++)
			F[i]++;

		//update samples
		if(sample_rate>0){

			//check if this position has to be sampled
			//first text position is always sampled
			bool sampled = ((current_size%sample_rate)==0) or current_size==n-1;

			//always update bitvector
			sampled_positions.insert(terminator_pos,sampled);

			//update dynamic vector only if the position is sampled
			if(sampled)
				sa_samples.insert( sampled_positions.rank(terminator_pos,true), current_size );

		}

		current_size++;

		return terminator_pos;

	}